

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

conncache * Curl_conncache_init(int size)

{
  curl_hash *pcVar1;
  conncache *connc;
  conncache *pcStack_10;
  int size_local;
  
  pcStack_10 = (conncache *)(*Curl_ccalloc)(1,0x28);
  if (pcStack_10 == (conncache *)0x0) {
    pcStack_10 = (conncache *)0x0;
  }
  else {
    pcVar1 = Curl_hash_alloc(size,Curl_hash_str,Curl_str_key_compare,free_bundle_hash_entry);
    pcStack_10->hash = pcVar1;
    if (pcStack_10->hash == (curl_hash *)0x0) {
      (*Curl_cfree)(pcStack_10);
      pcStack_10 = (conncache *)0x0;
    }
  }
  return pcStack_10;
}

Assistant:

struct conncache *Curl_conncache_init(int size)
{
  struct conncache *connc;

  connc = calloc(1, sizeof(struct conncache));
  if(!connc)
    return NULL;

  connc->hash = Curl_hash_alloc(size, Curl_hash_str,
                                Curl_str_key_compare, free_bundle_hash_entry);

  if(!connc->hash) {
    free(connc);
    return NULL;
  }

  return connc;
}